

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Skeleton::Reset(Skeleton *this)

{
  Bone *this_00;
  Animation *this_01;
  bool bVar1;
  reference ppBVar2;
  reference ppAVar3;
  Animation **anim;
  iterator __end2_1;
  iterator __begin2_1;
  AnimationList *__range2_1;
  Bone **bone;
  iterator __end2;
  iterator __begin2;
  BoneList *__range2;
  Skeleton *this_local;
  
  __end2 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::begin
                     (&this->bones);
  bone = (Bone **)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::end
                            (&this->bones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
                                *)&bone);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppBVar2;
    if (this_00 != (Bone *)0x0) {
      Bone::~Bone(this_00);
      operator_delete(this_00,0xf8);
    }
    *ppBVar2 = (Bone *)0x0;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::clear(&this->bones);
  __end2_1 = std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
             begin(&this->animations);
  anim = (Animation **)
         std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::end
                   (&this->animations);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<Assimp::Ogre::Animation_**,_std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>_>
                        *)&anim);
    if (!bVar1) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::Animation_**,_std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>_>
              ::operator*(&__end2_1);
    this_01 = *ppAVar3;
    if (this_01 != (Animation *)0x0) {
      Ogre::Animation::~Animation(this_01);
      operator_delete(this_01,0x70);
    }
    *ppAVar3 = (Animation *)0x0;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::Animation_**,_std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::clear
            (&this->animations);
  return;
}

Assistant:

void Skeleton::Reset()
{
    for(auto &bone : bones) {
        OGRE_SAFE_DELETE(bone)
    }
    bones.clear();
    for(auto &anim : animations) {
        OGRE_SAFE_DELETE(anim)
    }
    animations.clear();
}